

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_integer64v(NegativeTestContext *ctx)

{
  allocator<char> local_39;
  GLint64 params;
  string local_30;
  
  params = -1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_ENUM is generated if pname is not one of the allowed values.",&local_39);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glGetInteger64v(&ctx->super_CallLogWrapper,0xffffffff,&params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_integer64v (NegativeTestContext& ctx)
{
	GLint64 params = -1;
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not one of the allowed values.");
	ctx.glGetInteger64v(-1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}